

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O1

void __thiscall
EncodingTable::addEntry(EncodingTable *this,uchar *hex,size_t hexLength,string *value)

{
  pointer *ppTVar1;
  iterator __position;
  TableEntry entry;
  TableEntry local_38;
  
  if (value->_M_string_length != 0) {
    Trie::insert(&this->lookup,(value->_M_dataplus)._M_p,
                 ((long)(this->entries).
                        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->entries).
                        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_38.hexPos = ByteArray::append(&this->hexData,hex,hexLength);
    local_38.valueLen = value->_M_string_length;
    __position._M_current =
         (this->entries).
         super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->entries).
        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.hexLen = hexLength;
      std::vector<EncodingTable::TableEntry,std::allocator<EncodingTable::TableEntry>>::
      _M_realloc_insert<EncodingTable::TableEntry_const&>
                ((vector<EncodingTable::TableEntry,std::allocator<EncodingTable::TableEntry>> *)
                 &this->entries,__position,&local_38);
    }
    else {
      (__position._M_current)->valueLen = local_38.valueLen;
      (__position._M_current)->hexPos = local_38.hexPos;
      (__position._M_current)->hexLen = hexLength;
      ppTVar1 = &(this->entries).
                 super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void EncodingTable::addEntry(unsigned char* hex, size_t hexLength, const std::string& value)
{
	if (value.size() == 0)
		return;
	
	// insert into trie
	size_t index = entries.size();
	lookup.insert(value.c_str(),index);

	// add entry
	TableEntry entry;
	entry.hexPos = hexData.append(hex,hexLength);
	entry.hexLen = hexLength;
	entry.valueLen = value.size();

	entries.push_back(entry);
}